

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMA.hpp
# Opt level: O3

void __thiscall PCCompatible::i8237::write<8>(i8237 *this,uint8_t value)

{
  this->enable_memory_to_memory_ = (bool)(value & 1);
  this->enable_channel0_address_hold_ = (bool)(value >> 1 & 1);
  this->enable_controller_ = (bool)(value >> 2 & 1);
  this->compressed_timing_ = (bool)(value >> 3 & 1);
  this->rotating_priority_ = (bool)(value >> 4 & 1);
  this->extended_write_selection_ = (bool)(value >> 5 & 1);
  this->dreq_active_low_ = (bool)(value >> 6 & 1);
  this->dack_sense_active_high_ = (bool)(value >> 7);
  return;
}

Assistant:

void set_command(uint8_t value) {
//			printf("DMA: Set command %02x\n", value);
			enable_memory_to_memory_ = value & 0x01;
			enable_channel0_address_hold_ = value & 0x02;
			enable_controller_ = value & 0x04;
			compressed_timing_ = value & 0x08;
			rotating_priority_ = value & 0x10;
			extended_write_selection_ = value & 0x20;
			dreq_active_low_ = value & 0x40;
			dack_sense_active_high_ = value & 0x80;
		}